

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * get_METAL_uniform_array_varname(Context *ctx,RegisterType regtype,char *buf,size_t len)

{
  char *pcVar1;
  
  if (regtype == REG_TYPE_CONST) {
    pcVar1 = "float4";
  }
  else if (regtype == REG_TYPE_CONSTBOOL) {
    pcVar1 = "bool";
  }
  else if (regtype == REG_TYPE_CONSTINT) {
    pcVar1 = "int4";
  }
  else {
    pcVar1 = (char *)0x0;
    failf(ctx,"%s","BUG: used a uniform we don\'t know how to define.");
  }
  snprintf(buf,0x40,"uniforms.uniforms_%s",pcVar1);
  return buf;
}

Assistant:

static const char *get_METAL_uniform_array_varname(Context *ctx,
                                                  const RegisterType regtype,
                                                  char *buf, const size_t len)
{
    const char *shadertype = ctx->shader_type_str;
    const char *type = get_METAL_uniform_type(ctx, regtype);
    snprintf(buf, len, "uniforms.uniforms_%s", type);
    return buf;
}